

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O0

VarId __thiscall optimization::loop_unrolling::Rewriter::copy_var(Rewriter *this,VarId *var)

{
  size_type sVar1;
  value_type *__x;
  VarId *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  long *in_RSI;
  Displayable in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_bool> pVar3;
  VarId VVar4;
  VarId *id;
  VarId *in_stack_ffffffffffffff18;
  VarId *in_stack_ffffffffffffff20;
  Variable *__y;
  value_type *in_stack_ffffffffffffff28;
  pair<const_mir::inst::VarId,_mir::inst::VarId> *in_stack_ffffffffffffff30;
  pair<const_unsigned_int,_mir::inst::Variable> *this_00;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_ffffffffffffff40;
  pair<const_unsigned_int,_mir::inst::Variable> local_70;
  _Base_ptr local_48;
  undefined1 local_40;
  Variable local_38;
  
  sVar1 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first);
  if (sVar1 == 0) {
    get_new_VarId((Rewriter *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    __y = &local_38;
    std::pair<const_mir::inst::VarId,_mir::inst::VarId>::
    pair<mir::inst::VarId_&,_mir::inst::VarId_&,_true>
              (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,(VarId *)__y);
    pVar3 = std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::insert((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                      *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_48 = (_Base_ptr)pVar3.first._M_node;
    local_40 = pVar3.second;
    __x = (value_type *)(*in_RSI + 0x38);
    mir::inst::VarId::operator_cast_to_unsigned_int(in_RDX);
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::at(in_stack_ffffffffffffff40,
         (key_type_conflict *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    this_00 = &local_70;
    std::pair<const_unsigned_int,_mir::inst::Variable>::
    pair<mir::inst::VarId_&,_mir::inst::Variable_&,_true>(this_00,(VarId *)__x,__y);
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::insert((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)this_00,__x);
    std::pair<const_unsigned_int,_mir::inst::Variable>::~pair
              ((pair<const_unsigned_int,_mir::inst::Variable> *)0x1f310d);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::
    map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          *)in_stack_ffffffffffffff40,
         (key_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    mir::inst::VarId::VarId(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    uVar2 = extraout_RDX;
  }
  VVar4._8_8_ = uVar2;
  VVar4.super_Displayable._vptr_Displayable = in_RDI._vptr_Displayable;
  return VVar4;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    if (var_map.count(var)) {
      return var_map.at(var);
    }
    auto id = get_new_VarId();
    var_map.insert({var, id});
    func.variables.insert({id, func.variables.at(var)});
    return id;
  }